

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qedidparser.cpp
# Opt level: O0

bool __thiscall QEdidParser::parse(QEdidParser *this,QByteArray *blob)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  QByteArrayView id;
  bool bVar14;
  byte bVar15;
  int iVar16;
  int iVar17;
  char *pcVar18;
  ulong uVar19;
  reference puVar20;
  QByteArray *in_RSI;
  qsizetype in_RDI;
  long in_FS_OFFSET;
  QByteArrayView QVar21;
  uint j_3;
  uint j_2;
  uint j_1;
  uint j;
  uchar len;
  uchar desc;
  uint extensionId;
  uint i_1;
  int wy;
  int wx;
  int by;
  int bx;
  int gy;
  int gx;
  int ry;
  int rx;
  uint igamma;
  QEdidVendorId *it;
  QEdidVendorId *e;
  QEdidVendorId *b;
  uint offset;
  int i;
  quint32 serial;
  size_t length;
  quint8 *data;
  QList<unsigned_short> blueTRC;
  QList<unsigned_short> greenTRC;
  QList<unsigned_short> redTRC;
  QList<unsigned_short> whiteTRC;
  anon_class_1_0_00000001_for__M_comp compareVendorId;
  char pnpId [3];
  undefined7 in_stack_fffffffffffffda8;
  undefined1 in_stack_fffffffffffffdaf;
  unsigned_short in_stack_fffffffffffffdb0;
  unsigned_short in_stack_fffffffffffffdb2;
  unsigned_short in_stack_fffffffffffffdb4;
  unsigned_short in_stack_fffffffffffffdb6;
  QSizeF *in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd4;
  uint uVar22;
  uint in_stack_fffffffffffffdd8;
  uint in_stack_fffffffffffffddc;
  uint local_220;
  uint local_214;
  QEdidVendorId *in_stack_fffffffffffffe18;
  int local_1c8;
  bool local_199;
  qsizetype in_stack_fffffffffffffe70;
  storage_type *in_stack_fffffffffffffe78;
  QSizeF local_138;
  QSizeF local_128;
  char *local_100;
  storage_type *local_f8;
  undefined1 local_e8 [31];
  undefined1 local_c9;
  undefined1 local_40 [53];
  char local_b;
  char cStack_a;
  char local_9;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar18 = QByteArray::constData((QByteArray *)0xb7edd6);
  uVar19 = QByteArray::size(in_RSI);
  if (uVar19 < 0x80) {
    local_199 = false;
  }
  else if ((*pcVar18 == '\0') && (pcVar18[1] == -1)) {
    iVar16 = ((byte)pcVar18[8] & 3) * 8 + 0x41;
    cStack_a = (char)iVar16 + (char)((ulong)((byte)pcVar18[9] & 0xe0) / 0x20) + -1;
    local_b = (char)((ulong)((byte)pcVar18[8] & 0x7c) / 4) + '@';
    local_9 = (pcVar18[9] & 0x1fU) + 0x40;
    QString::QString((QString *)0xb7eeeb);
    QString::operator=((QString *)
                       CONCAT26(in_stack_fffffffffffffdb6,
                                CONCAT24(in_stack_fffffffffffffdb4,
                                         CONCAT22(in_stack_fffffffffffffdb2,
                                                  in_stack_fffffffffffffdb0))),
                       (QString *)CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8));
    QString::~QString((QString *)0xb7ef0e);
    iVar17 = (uint)(byte)pcVar18[0xc] + (uint)(byte)pcVar18[0xd] * 0x100 +
             (uint)(byte)pcVar18[0xe] * 0x10000 + (uint)(byte)pcVar18[0xf] * 0x1000000;
    if (iVar17 == 0) {
      QString::QString((QString *)0xb7efa9);
      QString::operator=((QString *)
                         CONCAT26(in_stack_fffffffffffffdb6,
                                  CONCAT24(in_stack_fffffffffffffdb4,
                                           CONCAT22(in_stack_fffffffffffffdb2,
                                                    in_stack_fffffffffffffdb0))),
                         (QString *)CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8));
      QString::~QString((QString *)0xb7efcc);
    }
    else {
      QString::number((uint)local_40,iVar17);
      QString::operator=((QString *)
                         CONCAT26(in_stack_fffffffffffffdb6,
                                  CONCAT24(in_stack_fffffffffffffdb4,
                                           CONCAT22(in_stack_fffffffffffffdb2,
                                                    in_stack_fffffffffffffdb0))),
                         (QString *)CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8));
      QString::~QString((QString *)0xb7ef9a);
    }
    for (local_1c8 = 0; local_1c8 < 4; local_1c8 = local_1c8 + 1) {
      iVar17 = local_1c8 * 0x12;
      if (((pcVar18[iVar17 + 0x36] == '\0') && (pcVar18[iVar17 + 0x37] == '\0')) &&
         (pcVar18[iVar17 + 0x38] == '\0')) {
        if (pcVar18[iVar17 + 0x39] == -4) {
          parseEdidString((QEdidParser *)
                          CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
                          (quint8 *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
          QString::operator=((QString *)
                             CONCAT26(in_stack_fffffffffffffdb6,
                                      CONCAT24(in_stack_fffffffffffffdb4,
                                               CONCAT22(in_stack_fffffffffffffdb2,
                                                        in_stack_fffffffffffffdb0))),
                             (QString *)
                             CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8));
          QString::~QString((QString *)0xb7f0b9);
        }
        else if (pcVar18[iVar17 + 0x39] == -2) {
          parseEdidString((QEdidParser *)
                          CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
                          (quint8 *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
          QString::operator=((QString *)
                             CONCAT26(in_stack_fffffffffffffdb6,
                                      CONCAT24(in_stack_fffffffffffffdb4,
                                               CONCAT22(in_stack_fffffffffffffdb2,
                                                        in_stack_fffffffffffffdb0))),
                             (QString *)
                             CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8));
          QString::~QString((QString *)0xb7f125);
        }
        else if (pcVar18[iVar17 + 0x39] == -1) {
          parseEdidString((QEdidParser *)
                          CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
                          (quint8 *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
          QString::operator=((QString *)
                             CONCAT26(in_stack_fffffffffffffdb6,
                                      CONCAT24(in_stack_fffffffffffffdb4,
                                               CONCAT22(in_stack_fffffffffffffdb2,
                                                        in_stack_fffffffffffffdb0))),
                             (QString *)
                             CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8));
          QString::~QString((QString *)0xb7f192);
        }
      }
    }
    QByteArrayView::QByteArrayView<3ul>
              ((QByteArrayView *)CONCAT44(iVar16,in_stack_fffffffffffffdc0),
               (char (*) [3])in_stack_fffffffffffffdb8);
    id.m_data = in_stack_fffffffffffffe78;
    id.m_size = in_stack_fffffffffffffe70;
    lookupVendorIdInSystemDatabase(id);
    QString::operator=((QString *)
                       CONCAT26(in_stack_fffffffffffffdb6,
                                CONCAT24(in_stack_fffffffffffffdb4,
                                         CONCAT22(in_stack_fffffffffffffdb2,
                                                  in_stack_fffffffffffffdb0))),
                       (QString *)CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8));
    QString::~QString((QString *)0xb7f203);
    bVar14 = QString::isEmpty((QString *)0xb7f211);
    if (bVar14) {
      local_c9 = 0xaa;
      std::begin<QEdidVendorId_const,2555ul>(&q_edidVendorIds);
      std::end<QEdidVendorId_const,2555ul>(&q_edidVendorIds);
      in_stack_fffffffffffffe18 =
           std::lower_bound<QEdidVendorId_const*,char[3],QEdidParser::parse(QByteArray_const&)::__0>
                     (q_edidVendorIds,&UNK_00c00fbc,&stack0xfffffffffffffff5);
      if ((in_stack_fffffffffffffe18 != (QEdidVendorId *)&UNK_00c00fbc) &&
         (iVar17 = strncmp(in_stack_fffffffffffffe18->id,&stack0xfffffffffffffff5,3), iVar17 == 0))
      {
        local_100 = "Avolites Ltd" +
                    (int)(uint)q_edidVendorNamesOffsets
                               [(long)(in_stack_fffffffffffffe18 + -0x2ff9f4) >> 2];
        QByteArrayView::QByteArrayView<const_char_*,_true>
                  ((QByteArrayView *)CONCAT44(iVar16,in_stack_fffffffffffffdc0),
                   (char **)in_stack_fffffffffffffdb8);
        QVar21.m_data = local_f8;
        QVar21.m_size = (qsizetype)local_e8;
        QString::fromUtf8(QVar21);
        QString::operator=((QString *)
                           CONCAT26(in_stack_fffffffffffffdb6,
                                    CONCAT24(in_stack_fffffffffffffdb4,
                                             CONCAT22(in_stack_fffffffffffffdb2,
                                                      in_stack_fffffffffffffdb0))),
                           (QString *)CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8))
        ;
        QString::~QString((QString *)0xb7f32f);
      }
    }
    bVar14 = QString::isEmpty((QString *)0xb7f33f);
    if (bVar14) {
      in_stack_fffffffffffffdb8 = (QSizeF *)&stack0xfffffffffffffff5;
      std::size<char,3ul>((char (*) [3])&stack0xfffffffffffffff5);
      QString::fromUtf8((char *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),in_RDI
                       );
      QString::operator=((QString *)
                         CONCAT26(in_stack_fffffffffffffdb6,
                                  CONCAT24(in_stack_fffffffffffffdb4,
                                           CONCAT22(in_stack_fffffffffffffdb2,
                                                    in_stack_fffffffffffffdb0))),
                         (QString *)CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8));
      QString::~QString((QString *)0xb7f397);
    }
    QSizeF::QSizeF(&local_138,(double)(byte)pcVar18[0x15],(double)(byte)pcVar18[0x16]);
    local_128 = ::operator*(in_stack_fffffffffffffdb8,
                            (qreal)CONCAT26(in_stack_fffffffffffffdb6,
                                            CONCAT24(in_stack_fffffffffffffdb4,
                                                     CONCAT22(in_stack_fffffffffffffdb2,
                                                              in_stack_fffffffffffffdb0))));
    *(qreal *)(in_RDI + 0x60) = local_128.wd;
    *(qreal *)(in_RDI + 0x68) = local_128.ht;
    if (pcVar18[0x17] == 0xff) {
      *(undefined8 *)(in_RDI + 0x70) = 0;
      *(undefined1 *)(in_RDI + 0xd1) = 1;
    }
    else {
      *(double *)(in_RDI + 0x70) = (double)((float)(byte)pcVar18[0x17] / 100.0) + 1.0;
      *(undefined1 *)(in_RDI + 0xd1) = 0;
    }
    *(bool *)(in_RDI + 0xd0) = (pcVar18[0x18] & 4U) != 0;
    bVar1 = pcVar18[0x19];
    bVar15 = pcVar18[0x19];
    bVar2 = pcVar18[0x19];
    bVar3 = pcVar18[0x1a];
    bVar4 = pcVar18[0x1a];
    bVar5 = pcVar18[0x1a];
    bVar6 = pcVar18[0x1a];
    bVar7 = pcVar18[0x1c];
    bVar8 = pcVar18[0x1d];
    bVar9 = pcVar18[0x1e];
    bVar10 = pcVar18[0x1f];
    bVar11 = pcVar18[0x20];
    bVar12 = pcVar18[0x21];
    bVar13 = pcVar18[0x22];
    QPointF::setX((QPointF *)(in_RDI + 0x78),
                  (double)((float)((uint)(byte)pcVar18[0x1b] << 2 |
                                  (int)(uint)(byte)pcVar18[0x19] >> 6) * 0.0009765625));
    QPointF::setY((QPointF *)(in_RDI + 0x78),
                  (double)((float)((uint)bVar7 << 2 | (int)(uint)bVar1 >> 4 & 3U) * 0.0009765625));
    QPointF::setX((QPointF *)(in_RDI + 0x88),
                  (double)((float)((uint)bVar8 << 2 | (int)(uint)bVar15 >> 2 & 3U) * 0.0009765625));
    QPointF::setY((QPointF *)(in_RDI + 0x88),
                  (double)((float)((uint)bVar9 << 2 | bVar2 & 3) * 0.0009765625));
    QPointF::setX((QPointF *)(in_RDI + 0x98),
                  (double)((float)((uint)bVar10 << 2 | (int)(uint)bVar3 >> 6) * 0.0009765625));
    QPointF::setY((QPointF *)(in_RDI + 0x98),
                  (double)((float)((uint)bVar11 << 2 | (int)(uint)bVar4 >> 4 & 3U) * 0.0009765625));
    QPointF::setX((QPointF *)(in_RDI + 0xa8),
                  (double)((float)((uint)bVar12 << 2 | (int)(uint)bVar5 >> 2 & 3U) * 0.0009765625));
    QPointF::setY((QPointF *)(in_RDI + 0xa8),
                  (double)((float)((uint)bVar13 << 2 | bVar6 & 3) * 0.0009765625));
    for (local_214 = 1; (ulong)local_214 < uVar19 >> 7; local_214 = local_214 + 1) {
      if (pcVar18[local_214 << 7] == '@') {
        bVar1 = pcVar18[local_214 * 0x80 + 0x51];
        bVar15 = bVar1 & 0x3f;
        if ((bVar1 & 0xc0) == 0x40) {
          if (0x2d < bVar15) {
            local_199 = false;
            goto LAB_00b7fbba;
          }
          QList<unsigned_short>::QList((QList<unsigned_short> *)0xb7f7ed);
          QList<unsigned_short>::reserve
                    ((QList<unsigned_short> *)
                     CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
                     (qsizetype)in_stack_fffffffffffffe18);
          for (local_220 = 0; local_220 < bVar15; local_220 = local_220 + 1) {
            in_stack_fffffffffffffdb6 = (ushort)(byte)pcVar18[local_220 + 0x52] * 0x101;
            puVar20 = QList<unsigned_short>::operator[]
                                ((QList<unsigned_short> *)
                                 CONCAT26(in_stack_fffffffffffffdb6,
                                          CONCAT24(in_stack_fffffffffffffdb4,
                                                   CONCAT22(in_stack_fffffffffffffdb2,
                                                            in_stack_fffffffffffffdb0))),
                                 CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8));
            *puVar20 = in_stack_fffffffffffffdb6;
          }
          puVar20 = QList<unsigned_short>::operator[]
                              ((QList<unsigned_short> *)
                               CONCAT26(in_stack_fffffffffffffdb6,
                                        CONCAT24(in_stack_fffffffffffffdb4,
                                                 CONCAT22(in_stack_fffffffffffffdb2,
                                                          in_stack_fffffffffffffdb0))),
                               CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8));
          *puVar20 = 0xffff;
          QList<QList<unsigned_short>_>::append
                    ((QList<QList<unsigned_short>_> *)
                     CONCAT26(in_stack_fffffffffffffdb6,
                              CONCAT24(in_stack_fffffffffffffdb4,
                                       CONCAT22(in_stack_fffffffffffffdb2,in_stack_fffffffffffffdb0)
                                      )),
                     (parameter_type)CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8));
          QList<unsigned_short>::~QList((QList<unsigned_short> *)0xb7f8a1);
        }
        else if ((bVar1 & 0xc0) == 0x80) {
          if (0xf < bVar15) {
            local_199 = false;
            goto LAB_00b7fbba;
          }
          QList<unsigned_short>::QList((QList<unsigned_short> *)0xb7f90c);
          QList<unsigned_short>::QList((QList<unsigned_short> *)0xb7f946);
          QList<unsigned_short>::QList((QList<unsigned_short> *)0xb7f980);
          QList<unsigned_short>::reserve
                    ((QList<unsigned_short> *)
                     CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
                     (qsizetype)in_stack_fffffffffffffe18);
          QList<unsigned_short>::reserve
                    ((QList<unsigned_short> *)
                     CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
                     (qsizetype)in_stack_fffffffffffffe18);
          QList<unsigned_short>::reserve
                    ((QList<unsigned_short> *)
                     CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
                     (qsizetype)in_stack_fffffffffffffe18);
          for (in_stack_fffffffffffffddc = 0; in_stack_fffffffffffffddc < bVar15;
              in_stack_fffffffffffffddc = in_stack_fffffffffffffddc + 1) {
            in_stack_fffffffffffffdb4 =
                 (ushort)(byte)pcVar18[in_stack_fffffffffffffddc + 0x52] * 0x101;
            puVar20 = QList<unsigned_short>::operator[]
                                ((QList<unsigned_short> *)
                                 CONCAT26(in_stack_fffffffffffffdb6,
                                          CONCAT24(in_stack_fffffffffffffdb4,
                                                   CONCAT22(in_stack_fffffffffffffdb2,
                                                            in_stack_fffffffffffffdb0))),
                                 CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8));
            *puVar20 = in_stack_fffffffffffffdb4;
          }
          puVar20 = QList<unsigned_short>::operator[]
                              ((QList<unsigned_short> *)
                               CONCAT26(in_stack_fffffffffffffdb6,
                                        CONCAT24(in_stack_fffffffffffffdb4,
                                                 CONCAT22(in_stack_fffffffffffffdb2,
                                                          in_stack_fffffffffffffdb0))),
                               CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8));
          *puVar20 = 0xffff;
          for (in_stack_fffffffffffffdd8 = 0; in_stack_fffffffffffffdd8 < bVar15;
              in_stack_fffffffffffffdd8 = in_stack_fffffffffffffdd8 + 1) {
            in_stack_fffffffffffffdb2 =
                 (ushort)(byte)pcVar18[in_stack_fffffffffffffdd8 + 0x61] * 0x101;
            puVar20 = QList<unsigned_short>::operator[]
                                ((QList<unsigned_short> *)
                                 CONCAT26(in_stack_fffffffffffffdb6,
                                          CONCAT24(in_stack_fffffffffffffdb4,
                                                   CONCAT22(in_stack_fffffffffffffdb2,
                                                            in_stack_fffffffffffffdb0))),
                                 CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8));
            *puVar20 = in_stack_fffffffffffffdb2;
          }
          puVar20 = QList<unsigned_short>::operator[]
                              ((QList<unsigned_short> *)
                               CONCAT26(in_stack_fffffffffffffdb6,
                                        CONCAT24(in_stack_fffffffffffffdb4,
                                                 CONCAT22(in_stack_fffffffffffffdb2,
                                                          in_stack_fffffffffffffdb0))),
                               CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8));
          *puVar20 = 0xffff;
          for (uVar22 = 0; uVar22 < bVar15; uVar22 = uVar22 + 1) {
            in_stack_fffffffffffffdb0 = (ushort)(byte)pcVar18[uVar22 + 0x70] * 0x101;
            puVar20 = QList<unsigned_short>::operator[]
                                ((QList<unsigned_short> *)
                                 CONCAT26(in_stack_fffffffffffffdb6,
                                          CONCAT24(in_stack_fffffffffffffdb4,
                                                   CONCAT22(in_stack_fffffffffffffdb2,
                                                            in_stack_fffffffffffffdb0))),
                                 CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8));
            *puVar20 = in_stack_fffffffffffffdb0;
          }
          puVar20 = QList<unsigned_short>::operator[]
                              ((QList<unsigned_short> *)
                               CONCAT26(in_stack_fffffffffffffdb6,
                                        CONCAT24(in_stack_fffffffffffffdb4,
                                                 CONCAT22(in_stack_fffffffffffffdb2,
                                                          in_stack_fffffffffffffdb0))),
                               CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8));
          *puVar20 = 0xffff;
          QList<QList<unsigned_short>_>::append
                    ((QList<QList<unsigned_short>_> *)
                     CONCAT26(in_stack_fffffffffffffdb6,
                              CONCAT24(in_stack_fffffffffffffdb4,
                                       CONCAT22(in_stack_fffffffffffffdb2,in_stack_fffffffffffffdb0)
                                      )),
                     (parameter_type)CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8));
          QList<QList<unsigned_short>_>::append
                    ((QList<QList<unsigned_short>_> *)
                     CONCAT26(in_stack_fffffffffffffdb6,
                              CONCAT24(in_stack_fffffffffffffdb4,
                                       CONCAT22(in_stack_fffffffffffffdb2,in_stack_fffffffffffffdb0)
                                      )),
                     (parameter_type)CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8));
          QList<QList<unsigned_short>_>::append
                    ((QList<QList<unsigned_short>_> *)
                     CONCAT26(in_stack_fffffffffffffdb6,
                              CONCAT24(in_stack_fffffffffffffdb4,
                                       CONCAT22(in_stack_fffffffffffffdb2,in_stack_fffffffffffffdb0)
                                      )),
                     (parameter_type)CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8));
          QList<unsigned_short>::~QList((QList<unsigned_short> *)0xb7fb82);
          QList<unsigned_short>::~QList((QList<unsigned_short> *)0xb7fb8f);
          QList<unsigned_short>::~QList((QList<unsigned_short> *)0xb7fb9c);
        }
      }
    }
    local_199 = true;
  }
  else {
    local_199 = false;
  }
LAB_00b7fbba:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_199;
}

Assistant:

bool QEdidParser::parse(const QByteArray &blob)
{
    const quint8 *data = reinterpret_cast<const quint8 *>(blob.constData());
    const size_t length = blob.size();

    // Verify header
    if (length < 128)
        return false;
    if (data[0] != 0x00 || data[1] != 0xff)
        return false;

    /* Decode the PNP ID from three 5 bit words packed into 2 bytes
     * /--08--\/--09--\
     * 7654321076543210
     * |\---/\---/\---/
     * R  C1   C2   C3 */
    char pnpId[3];
    pnpId[0] = 'A' + ((data[EDID_OFFSET_PNP_ID] & 0x7c) / 4) - 1;
    pnpId[1] = 'A' + ((data[EDID_OFFSET_PNP_ID] & 0x3) * 8) + ((data[EDID_OFFSET_PNP_ID + 1] & 0xe0) / 32) - 1;
    pnpId[2] = 'A' + (data[EDID_OFFSET_PNP_ID + 1] & 0x1f) - 1;

    // Clear manufacturer
    manufacturer = QString();

    // Serial number, will be overwritten by an ASCII descriptor
    // when and if it will be found
    quint32 serial = data[EDID_OFFSET_SERIAL]
            + (data[EDID_OFFSET_SERIAL + 1] << 8)
            + (data[EDID_OFFSET_SERIAL + 2] << 16)
            + (data[EDID_OFFSET_SERIAL + 3] << 24);
    if (serial > 0)
        serialNumber = QString::number(serial);
    else
        serialNumber = QString();

    // Parse EDID data
    for (int i = 0; i < EDID_DATA_BLOCK_COUNT; ++i) {
        const uint offset = EDID_OFFSET_DATA_BLOCKS + i * 18;

        if (data[offset] != 0 || data[offset + 1] != 0 || data[offset + 2] != 0)
            continue;

        if (data[offset + 3] == EDID_DESCRIPTOR_PRODUCT_NAME)
            model = parseEdidString(&data[offset + 5]);
        else if (data[offset + 3] == EDID_DESCRIPTOR_ALPHANUMERIC_STRING)
            identifier = parseEdidString(&data[offset + 5]);
        else if (data[offset + 3] == EDID_DESCRIPTOR_SERIAL_NUMBER)
            serialNumber = parseEdidString(&data[offset + 5]);
    }

    // Try to use cache first because it is potentially more updated
    manufacturer = lookupVendorIdInSystemDatabase(pnpId);

    if (manufacturer.isEmpty()) {
        // Find the manufacturer from the vendor lookup table
        const auto compareVendorId = [](const QEdidVendorId &vendor, const char *str)
        {
            return strncmp(vendor.id, str, 3) < 0;
        };

        const auto b = std::begin(q_edidVendorIds);
        const auto e = std::end(q_edidVendorIds);
        auto it = std::lower_bound(b,
                                   e,
                                   pnpId,
                                   compareVendorId);

        if (it != e && strncmp(it->id, pnpId, 3) == 0)
            manufacturer = QString::fromUtf8(q_edidVendorNames + q_edidVendorNamesOffsets[it - b]);
    }

    // If we don't know the manufacturer, fallback to PNP ID
    if (manufacturer.isEmpty())
        manufacturer = QString::fromUtf8(pnpId, std::size(pnpId));

    // Physical size
    physicalSize = QSizeF(data[EDID_PHYSICAL_WIDTH], data[EDID_OFFSET_PHYSICAL_HEIGHT]) * 10;

    // Gamma and transfer function
    const uint igamma = data[EDID_TRANSFER_FUNCTION];
    if (igamma != 0xff) {
        gamma = 1.0 + (igamma / 100.0f);
        useTables = false;
    } else {
        gamma = 0.0; // Defined in DI-EXT
        useTables = true;
    }
    sRgb = data[EDID_FEATURE_SUPPORT] & 0x04;

    // Chromaticities
    int rx = (data[EDID_CHROMATICITIES_BLOCK] >> 6) & 0x03;
    int ry = (data[EDID_CHROMATICITIES_BLOCK] >> 4) & 0x03;
    int gx = (data[EDID_CHROMATICITIES_BLOCK] >> 2) & 0x03;
    int gy = (data[EDID_CHROMATICITIES_BLOCK] >> 0) & 0x03;
    int bx = (data[EDID_CHROMATICITIES_BLOCK + 1] >> 6) & 0x03;
    int by = (data[EDID_CHROMATICITIES_BLOCK + 1] >> 4) & 0x03;
    int wx = (data[EDID_CHROMATICITIES_BLOCK + 1] >> 2) & 0x03;
    int wy = (data[EDID_CHROMATICITIES_BLOCK + 1] >> 0) & 0x03;
    rx |= data[EDID_CHROMATICITIES_BLOCK + 2] << 2;
    ry |= data[EDID_CHROMATICITIES_BLOCK + 3] << 2;
    gx |= data[EDID_CHROMATICITIES_BLOCK + 4] << 2;
    gy |= data[EDID_CHROMATICITIES_BLOCK + 5] << 2;
    bx |= data[EDID_CHROMATICITIES_BLOCK + 6] << 2;
    by |= data[EDID_CHROMATICITIES_BLOCK + 7] << 2;
    wx |= data[EDID_CHROMATICITIES_BLOCK + 8] << 2;
    wy |= data[EDID_CHROMATICITIES_BLOCK + 9] << 2;

    redChromaticity.setX(rx * (1.0f / 1024.0f));
    redChromaticity.setY(ry * (1.0f / 1024.0f));
    greenChromaticity.setX(gx * (1.0f / 1024.0f));
    greenChromaticity.setY(gy * (1.0f / 1024.0f));
    blueChromaticity.setX(bx * (1.0f / 1024.0f));
    blueChromaticity.setY(by * (1.0f / 1024.0f));
    whiteChromaticity.setX(wx * (1.0f / 1024.0f));
    whiteChromaticity.setY(wy * (1.0f / 1024.0f));

    // Find extensions
    for (uint i = 1; i < length / 128; ++i) {
        uint extensionId = data[i * 128];
        if (extensionId == 0x40) { // DI-EXT
            // 0x0E (sub-pixel layout)
            // 0x20->0x22 (bits per color)
            // 0x51->0x7e Transfer characteristics
            const uchar desc = data[i * 128 + 0x51];
            const uchar len = desc & 0x3f;
            if ((desc & 0xc0) == 0x40) {
                if (len > 45)
                    return false;
                QList<uint16_t> whiteTRC;
                whiteTRC.reserve(len + 1);
                for (uint j = 0; j < len; ++j)
                    whiteTRC[j] = data[0x52 + j] * 0x101;
                whiteTRC[len] = 0xffff;
                tables.append(whiteTRC);
            } else if ((desc & 0xc0) == 0x80) {
                if (len > 15)
                    return false;
                QList<uint16_t> redTRC;
                QList<uint16_t> greenTRC;
                QList<uint16_t> blueTRC;
                blueTRC.reserve(len + 1);
                greenTRC.reserve(len + 1);
                redTRC.reserve(len + 1);
                for (uint j = 0; j < len; ++j)
                    blueTRC[j] = data[0x52 + j] * 0x101;
                blueTRC[len] = 0xffff;
                for (uint j = 0; j < len; ++j)
                    greenTRC[j] = data[0x61 + j] * 0x101;
                greenTRC[len] = 0xffff;
                for (uint j = 0; j < len; ++j)
                    redTRC[j] = data[0x70 + j] * 0x101;
                redTRC[len] = 0xffff;
                tables.append(redTRC);
                tables.append(greenTRC);
                tables.append(blueTRC);
            }
        }
    }

    return true;
}